

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O3

void __thiscall RandomTangentS2::test_method(RandomTangentS2 *this)

{
  Vector3d v;
  S2 Space;
  Point x;
  Ref_conflict *local_2d0;
  long local_2c8;
  void *local_2b8;
  undefined8 uStack_2b0;
  Ref_conflict *local_2a8;
  long local_2a0;
  void *local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  Ref_conflict *local_278;
  long local_270;
  undefined1 local_260;
  undefined8 local_258;
  shared_count sStack_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  Ref_conflict local_208 [24];
  S2 local_1f0 [136];
  undefined **local_168;
  undefined1 local_160;
  undefined8 *local_158;
  char **local_150;
  void *local_140;
  ConstSubPoint local_130 [272];
  
  mnf::S2::S2(local_1f0);
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  local_2b8 = (void *)0x0;
  uStack_2b0 = 0;
  local_2d0 = local_2a8;
  local_2c8 = local_2a0;
  if (-1 < local_2a0 || local_2a8 == (Ref_conflict *)0x0) {
    mnf::S2::randVec(local_208);
    free(local_2b8);
    local_218 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
    ;
    local_210 = "";
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,100);
    mnf::SubPoint::value();
    local_2b8 = (void *)0x0;
    uStack_2b0 = 0;
    local_2d0 = local_278;
    local_2c8 = local_270;
    if (-1 < local_270 || local_278 == (Ref_conflict *)0x0) {
      local_290 = (void *)0x0;
      uStack_288 = 0;
      local_2a0 = 3;
      local_280 = 0x3e45798ee2308c3a;
      local_2a8 = local_208;
      local_260 = mnf::Manifold::isInTxM
                            ((Ref_conflict *)local_1f0,(Ref_conflict *)&local_2d0,
                             (double *)&local_2a8);
      local_258 = 0;
      sStack_250.pi_ = (sp_counted_base *)0x0;
      local_150 = &local_238;
      local_238 = "Space.isInTxM(x.value(), v)";
      local_230 = "";
      local_160 = 0;
      local_168 = &PTR__lazy_ostream_00124c88;
      local_158 = &boost::unit_test::lazy_ostream::inst;
      local_248 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
      ;
      local_240 = "";
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_250);
      free(local_290);
      free(local_2b8);
      mnf::ConstSubPoint::~ConstSubPoint(local_130);
      free(local_140);
      mnf::Manifold::~Manifold((Manifold *)local_1f0);
      return;
    }
  }
  uStack_2b0 = 0;
  local_2b8 = (void *)0x0;
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomTangentS2)
{
  S2 Space;
  Point x = Space.createRandomPoint();
  Vector3d v = Space.randVec(x.value());
  BOOST_CHECK(Space.isInTxM(x.value(), v));
}